

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O0

void uo_cb_prepend_func(uo_cb *cb,uo_cb_func cb_func)

{
  uo_cb_func_linklist *link;
  uo_cb_func_linklist *cb_func_linklist;
  uo_cb_func cb_func_local;
  uo_cb *cb_local;
  
  link = uo_cb_func_linkpool_rent();
  link->item = cb_func;
  uo__linklist_link((cb->funclist).next,&link->link);
  return;
}

Assistant:

void uo_cb_prepend_func(
    uo_cb *cb,
    uo_cb_func cb_func)
{
    uo_cb_func_linklist *cb_func_linklist = uo_cb_func_linkpool_rent();
    cb_func_linklist->item = cb_func;
    uo_linklist_link(cb->funclist.next, cb_func_linklist);
}